

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::DisplayConstraintGraph(cmComputeLinkDepends *this)

{
  string_view sep;
  FILE *__stream;
  reference rng;
  ulong uVar1;
  size_type sVar2;
  ostream *poVar3;
  reference s;
  undefined8 uVar4;
  string local_218 [32];
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  string_view local_1e8;
  string_view local_1d8;
  string local_1c8;
  reference local_198;
  EdgeList *nl;
  undefined1 local_188 [4];
  uint i;
  ostringstream e;
  cmComputeLinkDepends *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  nl._4_4_ = 0;
  while( true ) {
    uVar1 = (ulong)nl._4_4_;
    sVar2 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                      (&(this->EntryConstraintGraph).
                        super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
    __stream = _stderr;
    if (sVar2 <= uVar1) break;
    local_198 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                          (&(this->EntryConstraintGraph).
                            super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                           (ulong)nl._4_4_);
    poVar3 = std::operator<<((ostream *)local_188,"item ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,nl._4_4_);
    poVar3 = std::operator<<(poVar3," is [");
    s = std::
        vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
        operator[](&this->EntryList,(ulong)nl._4_4_);
    poVar3 = ::operator<<(poVar3,&s->Item);
    std::operator<<(poVar3,"]\n");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"  item ");
    rng = local_198;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1e8," must follow it");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f8,"\n");
    sep._M_str = local_1f8._M_str;
    sep._M_len = local_1f8._M_len;
    cmWrap<cmGraphEdgeList>(&local_1c8,local_1d8,rng,local_1e8,sep);
    poVar3 = std::operator<<((ostream *)local_188,(string *)&local_1c8);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    nl._4_4_ = nl._4_4_ + 1;
  }
  std::__cxx11::ostringstream::str();
  uVar4 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s\n",uVar4);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayConstraintGraph()
{
  // Display the graph nodes and their edges.
  std::ostringstream e;
  for (unsigned int i = 0; i < this->EntryConstraintGraph.size(); ++i) {
    EdgeList const& nl = this->EntryConstraintGraph[i];
    e << "item " << i << " is [" << this->EntryList[i].Item << "]\n";
    e << cmWrap("  item ", nl, " must follow it", "\n") << "\n";
  }
  fprintf(stderr, "%s\n", e.str().c_str());
}